

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::UDFAverageFunction>
               (dtime_t *idata,AggregateInputData *aggr_input_data,
               udf_avg_state_t<duckdb::dtime_t> **states,SelectionVector *isel,SelectionVector *ssel
               ,ValidityMask *mask,idx_t count)

{
  long lVar1;
  long lVar2;
  udf_avg_state_t<duckdb::dtime_t> *puVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  idx_t row_idx;
  idx_t i;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar1 = *(long *)isel;
    lVar4 = *(long *)ssel;
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      uVar8 = uVar6;
      if (lVar1 != 0) {
        uVar8 = (ulong)*(uint *)(lVar1 + uVar6 * 4);
      }
      uVar9 = uVar6;
      if (lVar4 != 0) {
        uVar9 = (ulong)*(uint *)(lVar4 + uVar6 * 4);
      }
      puVar3 = states[uVar9];
      lVar2 = idata[uVar8].micros;
      puVar3->count = puVar3->count + 1;
      (puVar3->sum).micros = lVar2 + (puVar3->sum).micros;
    }
  }
  else {
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      row_idx = iVar7;
      if (*(long *)isel != 0) {
        row_idx = (idx_t)*(uint *)(*(long *)isel + iVar7 * 4);
      }
      iVar10 = iVar7;
      if (*(long *)ssel != 0) {
        iVar10 = (idx_t)*(uint *)(*(long *)ssel + iVar7 * 4);
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar5) {
        puVar3 = states[iVar10];
        lVar1 = idata[row_idx].micros;
        puVar3->count = puVar3->count + 1;
        (puVar3->sum).micros = lVar1 + (puVar3->sum).micros;
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}